

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::DiffuseAreaLight,pbrt::Transform_const&,pbrt::MediumHandle&,pbrt::SpectrumHandle&,float&,pbrt::ShapeHandle_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,bool&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,DiffuseAreaLight *p,Transform *args,
          MediumHandle *args_1,SpectrumHandle *args_2,float *args_3,ShapeHandle *args_4,
          Image *args_5,RGBColorSpace **args_6,bool *args_7,polymorphic_allocator<std::byte> *args_8
          )

{
  Float scale;
  undefined1 auVar1 [16];
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_168;
  TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
  local_160;
  MediumInterface local_158;
  Image local_148;
  
  local_158.inside =
       (MediumHandle)
       (args_1->
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
       ).bits;
  local_168.bits =
       (args_2->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  local_160.bits =
       (args_4->
       super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
       ).bits;
  scale = *args_3;
  local_148.format = args_5->format;
  local_148.resolution.super_Tuple2<pbrt::Point2,_int>.x =
       (args_5->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  local_148.resolution.super_Tuple2<pbrt::Point2,_int>.y =
       (args_5->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  local_158.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = local_158.inside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::InlinedVector(&local_148.channelNames,&args_5->channelNames);
  local_148.encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )(args_5->encoding).
           super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
           .bits;
  local_148.p8.alloc.memoryResource = (args_5->p8).alloc.memoryResource;
  local_148.p8.nAlloc = (args_5->p8).nAlloc;
  local_148.p8.nStored = (args_5->p8).nStored;
  auVar1 = ZEXT816(0) << 0x20;
  local_148.p8.ptr = (args_5->p8).ptr;
  (args_5->p8).nStored = 0;
  (args_5->p8).ptr = (uchar *)auVar1._0_8_;
  (args_5->p8).nAlloc = auVar1._8_8_;
  local_148.p16.alloc.memoryResource = (args_5->p16).alloc.memoryResource;
  local_148.p16.nAlloc = (args_5->p16).nAlloc;
  local_148.p16.nStored = (args_5->p16).nStored;
  local_148.p16.ptr = (args_5->p16).ptr;
  (args_5->p16).nStored = 0;
  (args_5->p16).ptr = (Half *)auVar1._0_8_;
  (args_5->p16).nAlloc = auVar1._8_8_;
  local_148.p32.alloc.memoryResource = (args_5->p32).alloc.memoryResource;
  local_148.p32.nAlloc = (args_5->p32).nAlloc;
  local_148.p32.nStored = (args_5->p32).nStored;
  local_148.p32.ptr = (args_5->p32).ptr;
  (args_5->p32).nStored = 0;
  (args_5->p32).ptr = (float *)auVar1._0_8_;
  (args_5->p32).nAlloc = auVar1._8_8_;
  pbrt::DiffuseAreaLight::DiffuseAreaLight
            (p,args,&local_158,(SpectrumHandle *)&local_168,scale,(ShapeHandle *)&local_160,
             &local_148,*args_6,*args_7,args_8->memoryResource);
  local_148.p32.nStored = 0;
  (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
  local_148.p16.nStored = 0;
  (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
  local_148.p8.nStored = 0;
  (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_148.channelNames);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }